

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallNormalHeapBlock.cpp
# Opt level: O2

void __thiscall
Memory::SmallNormalHeapBlockT<SmallAllocationBlockAttributes>::ScanInitialImplicitRoots
          (SmallNormalHeapBlockT<SmallAllocationBlockAttributes> *this,Recycler *recycler)

{
  ushort uVar1;
  ushort uVar2;
  ushort uVar3;
  code *pcVar4;
  bool bVar5;
  BOOLEAN BVar6;
  undefined4 *puVar7;
  ulong byteCount;
  ulong uVar8;
  void **obj;
  BVIndex i;
  long lVar9;
  
  bVar5 = HeapBlock::IsAnyNormalBlock((HeapBlock *)this);
  if (!bVar5) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar7 = 1;
    bVar5 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/SmallNormalHeapBlock.cpp"
                       ,0x50,"(this->IsAnyNormalBlock())","this->IsAnyNormalBlock()");
    if (!bVar5) {
      pcVar4 = (code *)invalidInstructionException();
      (*pcVar4)();
    }
    *puVar7 = 0;
  }
  uVar1 = (this->super_SmallHeapBlockT<SmallAllocationBlockAttributes>).objectCount;
  uVar8 = (ulong)uVar1;
  uVar2 = (this->super_SmallHeapBlockT<SmallAllocationBlockAttributes>).objectSize;
  byteCount = (ulong)uVar2;
  uVar3 = (this->super_SmallHeapBlockT<SmallAllocationBlockAttributes>).markCount;
  if ((uVar3 == uVar1) && (recycler->objectGraphDumper == (RecyclerObjectGraphDumper *)0x0)) {
    Recycler::ScanObjectInlineInterior
              (recycler,(void **)(this->super_SmallHeapBlockT<SmallAllocationBlockAttributes>).
                                 super_HeapBlock.address,byteCount * uVar8);
    return;
  }
  if (uVar3 != 0) {
    lVar9 = 0;
    i = 0;
    while (bVar5 = uVar8 != 0, uVar8 = uVar8 - 1, bVar5) {
      BVar6 = BVStatic<256UL>::Test
                        ((this->super_SmallHeapBlockT<SmallAllocationBlockAttributes>).markBits,i);
      if (BVar6 != '\0') {
        obj = (void **)((this->super_SmallHeapBlockT<SmallAllocationBlockAttributes>).
                        super_HeapBlock.address + lVar9);
        if (recycler->objectGraphDumper != (RecyclerObjectGraphDumper *)0x0) {
          RecyclerObjectGraphDumper::BeginDumpObject(recycler->objectGraphDumper,L"Implicit Root");
          if (recycler->objectGraphDumper != (RecyclerObjectGraphDumper *)0x0) {
            RecyclerObjectGraphDumper::DumpObjectReference(recycler->objectGraphDumper,obj,false);
            if (recycler->objectGraphDumper != (RecyclerObjectGraphDumper *)0x0) {
              RecyclerObjectGraphDumper::EndDumpObject(recycler->objectGraphDumper);
            }
          }
        }
        Recycler::ScanObjectInlineInterior(recycler,obj,byteCount);
      }
      i = i + (uVar2 >> 4);
      lVar9 = lVar9 + byteCount;
    }
  }
  return;
}

Assistant:

void
SmallNormalHeapBlockT<TBlockAttributes>::ScanInitialImplicitRoots(Recycler * recycler)
{
    Assert(this->IsAnyNormalBlock());

    uint const localObjectCount = this->objectCount;
    uint const localObjectSize = this->GetObjectSize();

    // We can use the markCount to optimize the scan because we update it in ResetMark
    if (this->markCount == localObjectCount
#ifdef RECYCLER_DUMP_OBJECT_GRAPH
        && recycler->objectGraphDumper == nullptr
#endif
        )
    {
        // TODO: only interior?
        recycler->ScanObjectInlineInterior((void **)this->GetAddress(), localObjectSize * localObjectCount);
    }
    else if (this->markCount != 0)
    {
        uint const localObjectBitDelta = this->GetObjectBitDelta();
        for (uint i = 0; i < localObjectCount; i++)
        {
            if (this->GetMarkedBitVector()->Test(i * localObjectBitDelta))
            {
                // TODO: only interior?
                void ** address = (void **)(this->GetAddress() + i * localObjectSize);
                DUMP_IMPLICIT_ROOT(recycler, address);
                recycler->ScanObjectInlineInterior(address, localObjectSize);
            }
        }
    }
}